

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,ReporterConfig *other)

{
  std::__cxx11::string::string((string *)this,(string *)other);
  this->stream = other->stream;
  this->includeSuccessfulResults = other->includeSuccessfulResults;
  ConfigData::ConfigData(&this->fullConfig,&other->fullConfig);
  return;
}

Assistant:

ReporterConfig( const ReporterConfig& other )
        :   name( other.name ),
            stream( other.stream ),
            includeSuccessfulResults( other.includeSuccessfulResults ),
            fullConfig( other.fullConfig )
        {}